

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,avector<AffineSpace3ff> *spaces,Ref<embree::SceneGraph::Node> *child)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar4;
  Node *pNVar5;
  undefined8 uVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  long lVar8;
  ulong uVar9;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = false;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_002c15c8;
  (this->spaces).time_range.lower = 0.0;
  (this->spaces).time_range.upper = 1.0;
  (this->spaces).spaces.size_active = spaces->size_active;
  sVar3 = spaces->size_alloced;
  (this->spaces).spaces.size_alloced = sVar3;
  pAVar7 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar3 << 6,0x10);
  (this->spaces).spaces.items = pAVar7;
  if ((this->spaces).spaces.size_active != 0) {
    lVar8 = 0x30;
    uVar9 = 0;
    do {
      pAVar7 = (this->spaces).spaces.items;
      pAVar4 = spaces->items;
      puVar1 = (undefined8 *)((long)pAVar4 + lVar8 + -0x30);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)pAVar7 + lVar8 + -0x30);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)pAVar4 + lVar8 + -0x20);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)pAVar7 + lVar8 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)pAVar4 + lVar8 + -0x10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)pAVar7 + lVar8 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)&(pAVar4->l).vx.field_0 + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pAVar7->l).vx.field_0 + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x40;
    } while (uVar9 < (this->spaces).spaces.size_active);
  }
  (this->spaces).quaternion = false;
  pNVar5 = child->ptr;
  (this->child).ptr = pNVar5;
  if (pNVar5 != (Node *)0x0) {
    (*(pNVar5->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode (const avector<AffineSpace3ff>& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}